

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

void __thiscall
glcts::CullDistance::APICoverageTest::APICoverageTest(APICoverageTest *this,Context *context)

{
  Context *context_local;
  APICoverageTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"coverage","Cull Distance API Coverage Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__APICoverageTest_0322a1b0;
  this->m_bo_id = 0;
  this->m_cs_id = 0;
  this->m_cs_to_id = 0;
  this->m_fbo_draw_id = 0;
  this->m_fbo_draw_to_id = 0;
  this->m_fbo_read_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

CullDistance::APICoverageTest::APICoverageTest(deqp::Context& context)
	: TestCase(context, "coverage", "Cull Distance API Coverage Test")
	, m_bo_id(0)
	, m_cs_id(0)
	, m_cs_to_id(0)
	, m_fbo_draw_id(0)
	, m_fbo_draw_to_id(0)
	, m_fbo_read_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Left blank on purpose */
}